

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mgm.c
# Opt level: O2

int test_block(EVP_CIPHER *ciph,char *name,uchar *nonce,size_t nlen,uchar *aad,size_t alen,
              uchar *ptext,size_t plen,uchar *exp_ctext,uchar *exp_tag,uchar *key,int small)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  size_t __n;
  EVP_CIPHER *pEVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  EVP_CIPHER_CTX *ctx;
  uchar *puVar9;
  uint uVar10;
  size_t sVar11;
  char *pcVar12;
  uchar *puVar13;
  uchar *puVar14;
  bool bVar15;
  uchar auStack_a0 [16];
  char *local_90;
  char *local_88;
  size_t local_80;
  uchar *local_78;
  EVP_CIPHER *local_70;
  uchar *local_68;
  size_t local_60;
  uchar *local_58;
  uchar *local_50;
  size_t local_48;
  uint local_40;
  int local_3c;
  int local_38;
  int outlen1;
  int outlen2;
  int tmplen;
  
  builtin_memcpy(auStack_a0,"\x0e\x14\x10",4);
  auStack_a0[4] = '\0';
  auStack_a0[5] = '\0';
  auStack_a0[6] = '\0';
  auStack_a0[7] = '\0';
  local_78 = nonce;
  local_70 = (EVP_CIPHER *)ciph;
  local_50 = aad;
  local_48 = alen;
  ctx = EVP_CIPHER_CTX_new();
  lVar3 = 8 - (plen + 0xf & 0xfffffffffffffff0);
  puVar13 = auStack_a0 + lVar3;
  local_80 = (size_t)(int)nlen;
  lVar2 = -(local_80 + 0xf & 0xfffffffffffffff0);
  puVar9 = puVar13 + lVar2;
  local_68 = puVar9;
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    *(code **)(puVar9 + -8) = _fini;
    iVar7 = OPENSSL_die("assertion failed: ctx",
                        "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/test_mgm.c"
                        ,0xa3);
    return iVar7;
  }
  local_88 = "small chunks";
  if (small == 0) {
    local_88 = "big chunks";
  }
  local_90 = name;
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"}\x14\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  printf("Encryption test %s [%s]: ",name);
  puVar9[-8] = 0x85;
  puVar9[-7] = '\x14';
  puVar9[-6] = '\x10';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_CIPHER_CTX_reset(ctx);
  pEVar5 = local_70;
  puVar9[-8] = 0x98;
  puVar9[-7] = '\x14';
  puVar9[-6] = '\x10';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_EncryptInit_ex(ctx,pEVar5,(ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0);
  puVar9[-8] = '\t';
  puVar9[-7] = '\0';
  puVar9[-6] = '\0';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  uVar1 = *(undefined8 *)(puVar9 + -8);
  local_60 = nlen;
  puVar9[-8] = 0xac;
  puVar9[-7] = '\x14';
  puVar9[-6] = '\x10';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_CIPHER_CTX_ctrl(ctx,(int)uVar1,(int)nlen,(void *)0x0);
  puVar14 = local_78;
  puVar9[-8] = 0xbf;
  puVar9[-7] = '\x14';
  puVar9[-6] = '\x10';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_EncryptInit_ex(ctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,key,puVar14);
  puVar9[-8] = 0xd0;
  puVar9[-7] = '\x14';
  puVar9[-6] = '\x10';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  memset(puVar13,0,plen);
  sVar11 = local_48;
  puVar14 = local_50;
  local_58 = puVar13;
  if (small == 0) {
    builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"f\x15\x10",4);
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    EVP_EncryptUpdate(ctx,(uchar *)0x0,&local_3c,puVar14,(int)sVar11);
    builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"|\x15\x10",4);
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    EVP_EncryptUpdate(ctx,puVar13,&local_38,ptext,(int)plen);
  }
  else {
    local_38 = 0;
    local_3c = 0;
    puVar9[-8] = '\x01';
    puVar9[-7] = '\0';
    puVar9[-6] = '\0';
    puVar9[-5] = '\0';
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    uVar1 = *(undefined8 *)(puVar9 + -8);
    sVar11 = local_48;
    puVar13 = local_50;
    while (bVar15 = sVar11 != 0, sVar11 = sVar11 - 1, bVar15) {
      builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"\v\x15\x10",4);
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      EVP_EncryptUpdate(ctx,(uchar *)0x0,&outlen1,puVar13,(int)uVar1);
      local_3c = local_3c + outlen1;
      puVar13 = puVar13 + 1;
    }
    puVar9[-8] = '\x01';
    puVar9[-7] = '\0';
    puVar9[-6] = '\0';
    puVar9[-5] = '\0';
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    uVar1 = *(undefined8 *)(puVar9 + -8);
    puVar13 = local_58;
    sVar11 = plen;
    puVar14 = ptext;
    while (bVar15 = sVar11 != 0, sVar11 = sVar11 - 1, bVar15) {
      builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"A\x15\x10",4);
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      EVP_EncryptUpdate(ctx,puVar13,&outlen1,puVar14,(int)uVar1);
      puVar13 = puVar13 + outlen1;
      local_38 = local_38 + outlen1;
      puVar14 = puVar14 + 1;
    }
  }
  puVar9[-8] = '\x01';
  puVar14 = local_58;
  puVar9[-7] = '\0';
  puVar9[-6] = '\0';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  local_40 = (uint)*(undefined8 *)(puVar9 + -8);
  puVar9[-8] = 0x99;
  puVar9[-7] = '\x15';
  puVar9[-6] = '\x10';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_EncryptFinal_ex(ctx,puVar14,&outlen1);
  puVar9[-8] = '\x10';
  sVar11 = local_60;
  puVar13 = local_68;
  puVar9[-7] = '\0';
  puVar9[-6] = '\0';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  uVar1 = *(undefined8 *)(puVar9 + -8);
  puVar9[-8] = 0xac;
  puVar9[-7] = '\x15';
  puVar9[-6] = '\x10';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_CIPHER_CTX_ctrl(ctx,(int)uVar1,(int)sVar11,puVar13);
  puVar9[-8] = 0xb4;
  puVar9[-7] = '\x15';
  puVar9[-6] = '\x10';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_CIPHER_CTX_reset(ctx);
  pcVar12 = "Test FAILED";
  if (((long)local_3c == local_48) && ((long)local_38 == plen)) {
    puVar9[-8] = 0xe0;
    puVar9[-7] = '\x15';
    puVar9[-6] = '\x10';
    puVar9[-5] = '\0';
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    iVar7 = bcmp(puVar14,exp_ctext,plen);
    puVar13 = local_68;
    __n = local_80;
    if (iVar7 == 0) {
      puVar9[-8] = 0xf5;
      puVar9[-7] = '\x15';
      puVar9[-6] = '\x10';
      puVar9[-5] = '\0';
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      iVar7 = bcmp(puVar13,exp_tag,__n);
      local_40 = (uint)(iVar7 != 0);
      pcVar12 = "Test passed";
      if (iVar7 != 0) {
        pcVar12 = "Test FAILED";
      }
    }
  }
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"\x1f\x16\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  puts(pcVar12);
  pcVar4 = local_88;
  pcVar12 = local_90;
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"8\x16\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  printf("Decryption test %s [%s]: ",pcVar12,pcVar4);
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"@\x16\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_CIPHER_CTX_reset(ctx);
  pEVar5 = local_70;
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"S\x16\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_DecryptInit_ex(ctx,pEVar5,(ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0);
  puVar9[-8] = '\t';
  sVar11 = local_60;
  puVar9[-7] = '\0';
  puVar9[-6] = '\0';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"d\x16\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_CIPHER_CTX_ctrl(ctx,(int)*(undefined8 *)(puVar9 + -8),(int)sVar11,(void *)0x0);
  puVar13 = local_78;
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"x\x16\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_DecryptInit_ex(ctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,key,puVar13);
  puVar9[-8] = 0x85;
  puVar9[-7] = '\x16';
  puVar9[-6] = '\x10';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  memset(puVar14,0,plen);
  sVar11 = local_48;
  puVar13 = local_50;
  if (small == 0) {
    builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"\x14\x17\x10",4);
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    EVP_DecryptUpdate(ctx,(uchar *)0x0,&local_3c,puVar13,(int)sVar11);
    builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,")\x17\x10",4);
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    EVP_DecryptUpdate(ctx,puVar14,&local_38,exp_ctext,(int)plen);
  }
  else {
    local_38 = 0;
    local_3c = 0;
    puVar9[-8] = '\x01';
    puVar9[-7] = '\0';
    puVar9[-6] = '\0';
    puVar9[-5] = '\0';
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    uVar1 = *(undefined8 *)(puVar9 + -8);
    sVar11 = local_48;
    while (puVar13 = local_50, bVar15 = sVar11 != 0, sVar11 = sVar11 - 1, bVar15) {
      puVar9[-8] = 0xb9;
      puVar9[-7] = '\x16';
      puVar9[-6] = '\x10';
      puVar9[-5] = '\0';
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      EVP_DecryptUpdate(ctx,(uchar *)0x0,&outlen1,puVar13,(int)uVar1);
      local_3c = local_3c + outlen1;
      local_50 = puVar13 + 1;
    }
    puVar9[-8] = '\x01';
    puVar9[-7] = '\0';
    puVar9[-6] = '\0';
    puVar9[-5] = '\0';
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    uVar1 = *(undefined8 *)(puVar9 + -8);
    sVar11 = plen;
    puVar13 = local_58;
    while (bVar15 = sVar11 != 0, sVar11 = sVar11 - 1, bVar15) {
      puVar9[-8] = 0xef;
      puVar9[-7] = '\x16';
      puVar9[-6] = '\x10';
      puVar9[-5] = '\0';
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      EVP_DecryptUpdate(ctx,puVar13,&outlen1,exp_ctext,(int)uVar1);
      puVar13 = puVar13 + outlen1;
      local_38 = local_38 + outlen1;
      exp_ctext = exp_ctext + 1;
    }
  }
  puVar9[-8] = '\x11';
  sVar11 = local_60;
  puVar9[-7] = '\0';
  puVar9[-6] = '\0';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"<\x17\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_CIPHER_CTX_ctrl(ctx,(int)*(undefined8 *)(puVar9 + -8),(int)sVar11,exp_tag);
  puVar13 = local_58;
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"O\x17\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  iVar7 = EVP_DecryptFinal_ex(ctx,puVar13,&outlen1);
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"Z\x17\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_CIPHER_CTX_reset(ctx);
  builtin_memcpy(auStack_a0 + lVar2 + lVar3 + -8,"b\x17\x10",4);
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  EVP_CIPHER_CTX_free(ctx);
  sVar11 = (size_t)local_3c;
  puVar9[-8] = '\x01';
  uVar6 = local_40;
  puVar9[-7] = '\0';
  puVar9[-6] = '\0';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  uVar10 = (uint)*(undefined8 *)(puVar9 + -8);
  pcVar12 = "Test FAILED";
  if ((sVar11 == local_48) && ((long)local_38 == plen)) {
    puVar9[-8] = 0x93;
    puVar9[-7] = '\x17';
    puVar9[-6] = '\x10';
    puVar9[-5] = '\0';
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    iVar8 = bcmp(puVar13,ptext,plen);
    uVar10 = (uint)(iVar7 != 1 || iVar8 != 0);
    pcVar12 = "Test passed";
    if (iVar7 != 1 || iVar8 != 0) {
      pcVar12 = "Test FAILED";
    }
  }
  puVar9[-8] = 0xbf;
  puVar9[-7] = '\x17';
  puVar9[-6] = '\x10';
  puVar9[-5] = '\0';
  puVar9[-4] = '\0';
  puVar9[-3] = '\0';
  puVar9[-2] = '\0';
  puVar9[-1] = '\0';
  puts(pcVar12);
  return uVar10 | uVar6;
}

Assistant:

static int test_block(const EVP_CIPHER *ciph, const char *name, const unsigned char *nonce, size_t nlen,
                      const unsigned char *aad, size_t alen, const unsigned char *ptext, size_t plen,
                      const unsigned char *exp_ctext, const unsigned char *exp_tag,
                      const unsigned char * key, int small)
{
    EVP_CIPHER_CTX *ctx = EVP_CIPHER_CTX_new();
    unsigned char *c = alloca(plen);
    int tag_len = nlen;
    unsigned char *t = alloca(tag_len);
    int outlen1, outlen2, tmplen;
    int ret = 0, rv, test, i;

    OPENSSL_assert(ctx);
    printf("Encryption test %s [%s]: ", name, small ? "small chunks" : "big chunks");

    // test encrypt
    EVP_CIPHER_CTX_init(ctx);
    EVP_EncryptInit_ex(ctx, ciph, NULL, NULL, NULL);                    // Set cipher type and mode
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_SET_IVLEN, nlen, NULL);      // Set IV length
    EVP_EncryptInit_ex(ctx, NULL, NULL, key, nonce);                    // Initialise key and IV
    memset(c, 0, plen);
    if (!small) {
        // test big chunks
        EVP_EncryptUpdate(ctx, NULL, &outlen1, aad, alen);              // Zero or more calls to specify any AAD
        EVP_EncryptUpdate(ctx, c, &outlen2, ptext, plen);               // Encrypt plaintext
    } else {
        // test small chunks
        outlen1 = outlen2 = 0;
        unsigned char *p;
        for (i = 0; i < alen; i++) {
            EVP_EncryptUpdate(ctx, NULL, &tmplen, aad + i, 1);
            outlen1 += tmplen;
        }
        for (i = 0, p = c; i < plen; i++) {
            EVP_EncryptUpdate(ctx, p, &tmplen, ptext + i, 1);
            p += tmplen;
            outlen2 += tmplen;
        }
    }
    EVP_EncryptFinal_ex(ctx, c, &tmplen);
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_GET_TAG, tag_len, t);
    EVP_CIPHER_CTX_cleanup(ctx);

    TEST_ASSERT(outlen1 != alen || outlen2 != plen ||
                memcmp(c, exp_ctext, plen) ||
                memcmp(t, exp_tag, tag_len));
    ret |= test;


    // test decrtypt
    printf("Decryption test %s [%s]: ", name, small ? "small chunks" : "big chunks");
    EVP_CIPHER_CTX_init(ctx);
    EVP_DecryptInit_ex(ctx, ciph, NULL, NULL, NULL);
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_SET_IVLEN, nlen, NULL);
    EVP_DecryptInit_ex(ctx, NULL, NULL, key, nonce);
    memset(c, 0, plen);
    if (!small) {
        // test big chunks
        EVP_DecryptUpdate(ctx, NULL, &outlen1, aad, alen);
        EVP_DecryptUpdate(ctx, c, &outlen2, exp_ctext, plen);
    } else {
        // test small chunks
        outlen1 = outlen2 = 0;
        unsigned char *p;
        for (i = 0; i < alen; i++) {
            EVP_DecryptUpdate(ctx, NULL, &tmplen, aad + i, 1);
            outlen1 += tmplen;
        }
        for (i = 0, p = c; i < plen; i++) {
            EVP_DecryptUpdate(ctx, p, &tmplen, exp_ctext + i, 1);
            p += tmplen;
            outlen2 += tmplen;
        }
    }
    EVP_CIPHER_CTX_ctrl(ctx, EVP_CTRL_AEAD_SET_TAG, tag_len, (void *)exp_tag);
    rv = EVP_DecryptFinal_ex(ctx, c, &tmplen);
    EVP_CIPHER_CTX_cleanup(ctx);
    EVP_CIPHER_CTX_free(ctx);

    TEST_ASSERT(outlen1 != alen || outlen2 != plen ||
                memcmp(c, ptext, plen) || rv != 1);
    ret |= test;

    return ret;
}